

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O2

UByteArray * __thiscall
TreeModel::uncompressedData(UByteArray *__return_storage_ptr__,TreeModel *this,UModelIndex *index)

{
  bool bVar1;
  
  bVar1 = UModelIndex::isValid(index);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(index->i + 0xf0));
  }
  else {
    (__return_storage_ptr__->d)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->d).field_2;
    (__return_storage_ptr__->d)._M_string_length = 0;
    (__return_storage_ptr__->d).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

UByteArray TreeModel::uncompressedData(const UModelIndex &index) const
{
    if (!index.isValid())
        return UByteArray();
    
    TreeItem *item = static_cast<TreeItem*>(index.internalPointer());
    return item->uncompressedData();
}